

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_tests.cpp
# Opt level: O2

void __thiscall
Inject::implemented_by_scope_singleton::test_method(implemented_by_scope_singleton *this)

{
  implemented_by<Inject::impl1,_(inject::component_scope)1> xxxx;
  component<Inject::impl1> xx;
  component<Inject::service> x;
  injected<Inject::service> second;
  injected<Inject::service> first;
  shared_count sStack_f8;
  provides<Inject::service> xxx;
  char *local_b8;
  char *local_b0;
  context<0> c;
  
  inject::context<0>::component<Inject::service>::component(&x);
  inject::context<0>::component<Inject::impl1>::component(&xx);
  inject::context<0>::component<Inject::impl1>::provides<Inject::service>::provides(&xxx);
  inject::context<0>::component<Inject::service>::
  implemented_by<Inject::impl1,_(inject::component_scope)1>::implemented_by(&xxxx);
  c._bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &c._bindings._M_t._M_impl.super__Rb_tree_header._M_header;
  c._vptr_context = (_func_int **)&PTR__context_0015fda8;
  c._bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  c._bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  c._bindings._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  c._singletons._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &c._singletons._M_t._M_impl.super__Rb_tree_header._M_header;
  c._singletons._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  c._singletons._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  c._singletons._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  c._parent = inject::context<0>::head()::_head;
  inject::context<0>::head()::_head = &c;
  inject::context<0>::current()::_current = inject::context<0>::head()::_head;
  c._bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       c._bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  c._singletons._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       c._singletons._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  inject::context<0>::injected<Inject::service>::injected(&first);
  inject::context<0>::injected<Inject::service>::injected(&second);
  local_b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
  ;
  local_b0 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_b8,0x7b);
  inject::context<0>::injected<Inject::service>::get(&first);
  inject::context<0>::injected<Inject::service>::get(&second);
  sStack_f8.pi_ = (sp_counted_base *)0x0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_f8);
  boost::detail::shared_count::~shared_count(&second._ptr.pn);
  boost::detail::shared_count::~shared_count(&first._ptr.pn);
  inject::context<0>::~context(&c);
  inject::context<0>::component<Inject::service>::
  implemented_by<Inject::impl1,_(inject::component_scope)1>::~implemented_by(&xxxx);
  inject::context<0>::component<Inject::impl1>::~component(&xx);
  inject::context<0>::component<Inject::service>::~component(&x);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(implemented_by_scope_singleton)
{
    context<>::component<service> x;
    context<>::component<impl1> xx;
    context<>::component<impl1>::provides<service> xxx;
    context<>::component<service>::implemented_by<impl1, scope_singleton> xxxx;

    context<> c;

    context<>::injected<service> first;
    context<>::injected<service> second;
    BOOST_CHECK(first.get() == second.get());
}